

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

PropertyDef * __thiscall PropertyDef::toJson(PropertyDef *this)

{
  int iVar1;
  QByteArray *in_RSI;
  long in_FS_OFFSET;
  undefined1 auVar2 [16];
  anon_class_8_1_89905061 local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  QJsonValue local_50 [24];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->name).d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)this);
  QString::fromUtf8<void>((QString *)local_68,in_RSI);
  QJsonValue::QJsonValue(local_50,(QString *)local_68);
  local_78 = QJsonObject::operator[]((QLatin1String *)this);
  QJsonValueRef::operator=((QJsonValueRef *)local_78,local_50);
  QJsonValue::~QJsonValue(local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
  QString::fromUtf8<void>((QString *)local_68,in_RSI + 1);
  QJsonValue::QJsonValue(local_50,(QString *)local_68);
  auVar2 = QJsonObject::operator[]((QLatin1String *)this);
  local_78 = auVar2;
  QJsonValueRef::operator=((QJsonValueRef *)local_78,local_50);
  QJsonValue::~QJsonValue(local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
  local_78._0_8_ = this;
  toJson::anon_class_8_1_89905061::operator()
            ((anon_class_8_1_89905061 *)local_78,"member",in_RSI + 2);
  toJson::anon_class_8_1_89905061::operator()((anon_class_8_1_89905061 *)local_78,"read",in_RSI + 3)
  ;
  toJson::anon_class_8_1_89905061::operator()
            ((anon_class_8_1_89905061 *)local_78,"write",in_RSI + 4);
  toJson::anon_class_8_1_89905061::operator()
            ((anon_class_8_1_89905061 *)local_78,"bindable",in_RSI + 5);
  toJson::anon_class_8_1_89905061::operator()
            ((anon_class_8_1_89905061 *)local_78,"reset",in_RSI + 6);
  toJson::anon_class_8_1_89905061::operator()
            ((anon_class_8_1_89905061 *)local_78,"notify",in_RSI + 0xb);
  toJson::anon_class_8_1_89905061::operator()
            ((anon_class_8_1_89905061 *)local_78,"privateClass",in_RSI + 0xc);
  local_80.prop = (QJsonObject *)this;
  toJson::anon_class_8_1_89905061::operator()(&local_80,"designable",in_RSI + 7);
  toJson::anon_class_8_1_89905061::operator()(&local_80,"scriptable",in_RSI + 8);
  toJson::anon_class_8_1_89905061::operator()(&local_80,"stored",in_RSI + 9);
  toJson::anon_class_8_1_89905061::operator()(&local_80,"user",in_RSI + 10);
  QJsonValue::QJsonValue(local_50,SUB81(in_RSI[0xd].d.size,0));
  local_68 = QJsonObject::operator[]((QLatin1String *)this);
  QJsonValueRef::operator=((QJsonValueRef *)local_68,local_50);
  QJsonValue::~QJsonValue(local_50);
  QJsonValue::QJsonValue(local_50,*(bool *)((long)&in_RSI[0xd].d.size + 1));
  auVar2 = QJsonObject::operator[]((QLatin1String *)this);
  local_68 = auVar2;
  QJsonValueRef::operator=((QJsonValueRef *)local_68,local_50);
  QJsonValue::~QJsonValue(local_50);
  QJsonValue::QJsonValue(local_50,*(bool *)((long)&in_RSI[0xd].d.size + 2));
  auVar2 = QJsonObject::operator[]((QLatin1String *)this);
  local_68 = auVar2;
  QJsonValueRef::operator=((QJsonValueRef *)local_68,local_50);
  QJsonValue::~QJsonValue(local_50);
  QJsonValue::QJsonValue(local_50,*(int *)((long)&in_RSI[0xd].d.size + 4));
  auVar2 = QJsonObject::operator[]((QLatin1String *)this);
  local_68 = auVar2;
  QJsonValueRef::operator=((QJsonValueRef *)local_68,local_50);
  QJsonValue::~QJsonValue(local_50);
  iVar1 = *(int *)&in_RSI[0xd].d.ptr;
  if (0 < iVar1) {
    QJsonValue::QJsonValue(local_50,iVar1);
    auVar2 = QJsonObject::operator[]((QLatin1String *)this);
    local_68 = auVar2;
    QJsonValueRef::operator=((QJsonValueRef *)local_68,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject PropertyDef::toJson() const
{
    QJsonObject prop;
    prop["name"_L1] = QString::fromUtf8(name);
    prop["type"_L1] = QString::fromUtf8(type);

    const auto jsonify = [&prop](const char *str, const QByteArray &member) {
        if (!member.isEmpty())
            prop[QLatin1StringView(str)] = QString::fromUtf8(member);
    };

    jsonify("member", member);
    jsonify("read", read);
    jsonify("write", write);
    jsonify("bindable", bind);
    jsonify("reset", reset);
    jsonify("notify", notify);
    jsonify("privateClass", inPrivateClass);

    const auto jsonifyBoolOrString = [&prop](const char *str, const QByteArray &boolOrString) {
        QJsonValue value;
        if (boolOrString == "true")
            value = true;
        else if (boolOrString == "false")
            value = false;
        else
            value = QString::fromUtf8(boolOrString); // function name to query at run-time
        prop[QLatin1StringView(str)] = value;
    };

    jsonifyBoolOrString("designable", designable);
    jsonifyBoolOrString("scriptable", scriptable);
    jsonifyBoolOrString("stored", stored);
    jsonifyBoolOrString("user", user);

    prop["constant"_L1] = constant;
    prop["final"_L1] = final;
    prop["required"_L1] = required;
    prop["index"_L1] = relativeIndex;
    if (revision > 0)
        prop["revision"_L1] = revision;

    return prop;
}